

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O2

Writer * __thiscall xe::xml::Writer::operator<<(Writer *this,EndElementType *param_1)

{
  ostream *poVar1;
  int i;
  int iVar2;
  char *pcVar3;
  
  if (this->m_state == STATE_ELEMENT_END) {
    std::operator<<(this->m_rawDst,"\n");
    for (iVar2 = 0;
        iVar2 < (int)((ulong)((long)(this->m_elementStack).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_elementStack).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5) + -1;
        iVar2 = iVar2 + 1) {
      std::operator<<(this->m_rawDst,"  ");
    }
  }
  else if (this->m_state == STATE_ELEMENT) {
    poVar1 = this->m_rawDst;
    pcVar3 = "/>";
    goto LAB_00133380;
  }
  poVar1 = std::operator<<(this->m_rawDst,"</");
  poVar1 = std::operator<<(poVar1,(string *)
                                  ((this->m_elementStack).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1));
  pcVar3 = ">";
LAB_00133380:
  std::operator<<(poVar1,pcVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(&this->m_elementStack);
  this->m_state = STATE_ELEMENT_END;
  return this;
}

Assistant:

Writer& Writer::operator<< (const EndElementType&)
{
	if (m_state == STATE_ELEMENT)
		m_rawDst << "/>";
	else
	{
		if (m_state == STATE_ELEMENT_END)
		{
			m_rawDst << "\n";
			for (int i = 0; i < (int)m_elementStack.size()-1; i++)
				m_rawDst << "  ";
		}

		m_rawDst << "</" << m_elementStack.back() << ">";
	}

	m_elementStack.pop_back();
	m_state = STATE_ELEMENT_END;

	return *this;
}